

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O3

void PreProcess(Mat *frame,Net *net,Size *inpSize)

{
  Mat blob;
  _OutputArray local_e0;
  long *local_c8;
  undefined8 uStack_c0;
  long local_b8 [2];
  _InputArray local_a8;
  undefined8 uStack_90;
  Mat local_80 [96];
  
  if ((inpSize->width < 1) || (inpSize->height < 1)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Incorrect input dimensions.  Exiting...",0x27);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x40);
    std::ostream::put(-0x40);
    std::ostream::flush();
  }
  else {
    cv::Mat::Mat(local_80);
    local_a8.sz.width = 0;
    local_a8.sz.height = 0;
    local_a8.flags = 0x1010000;
    local_e0.super__InputArray.sz.width = 0;
    local_e0.super__InputArray.sz.height = 0;
    local_e0.super__InputArray.flags = 0x2010000;
    local_b8[0] = 0;
    local_b8[1] = 0;
    local_c8 = (long *)0x0;
    uStack_c0 = 0;
    local_e0.super__InputArray.obj = local_80;
    local_a8.obj = frame;
    cv::dnn::dnn4_v20211004::blobFromImage
              (&local_a8,&local_e0,0.00392156862745098,(Size_ *)inpSize,(Scalar_ *)&local_c8,true,
               false,5);
    local_e0.super__InputArray.sz.width = 0;
    local_e0.super__InputArray.sz.height = 0;
    local_e0.super__InputArray.flags = 0x1010000;
    local_e0.super__InputArray.obj = local_80;
    local_c8 = local_b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"");
    local_a8.sz.width = 0;
    local_a8.sz.height = 0;
    uStack_90 = 0;
    local_a8.flags = 0;
    local_a8._4_4_ = 0;
    local_a8.obj = (void *)0x0;
    cv::dnn::dnn4_v20211004::Net::setInput
              ((_InputArray *)net,(string *)&local_e0,1.0,(Scalar_ *)&local_c8);
    if (local_c8 != local_b8) {
      operator_delete(local_c8,local_b8[0] + 1);
    }
    cv::Mat::~Mat(local_80);
  }
  return;
}

Assistant:

void PreProcess(cv::Mat const& frame, cv::dnn::Net& net, cv::Size const& inpSize) noexcept {
  if (inpSize.width <= 0 || inpSize.height <= 0) {
    std::cerr << "Incorrect input dimensions.  Exiting..." << std::endl;
    return;
  }

  //! Create a 4D blob from a frame.
  cv::Mat blob;
  cv::dnn::blobFromImage(frame, blob, 1. / 255., inpSize, cv::Scalar(), true, false);
  
  net.setInput(blob);
  return;
}